

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

string * __thiscall
slang::ast::getLexicalPath_abi_cxx11_(string *__return_storage_ptr__,ast *this,Scope *scope)

{
  Symbol *this_00;
  allocator<char> local_11;
  
  if ((this == (ast *)0x0) || (this_00 = *(Symbol **)(this + 8), this_00->kind == CompilationUnit))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    Symbol::appendLexicalPath(this_00,__return_storage_ptr__);
    if (((ulong)this_00->kind < 0x33) &&
       ((0x4000000c00000U >> ((ulong)this_00->kind & 0x3f) & 1) != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"::");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,'.');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getLexicalPath(const Scope* scope) {
    if (!scope || scope->asSymbol().kind == SymbolKind::CompilationUnit)
        return "";

    std::string str;
    auto& sym = scope->asSymbol();
    sym.appendLexicalPath(str);

    if (sym.kind == SymbolKind::Package || sym.kind == SymbolKind::ClassType ||
        sym.kind == SymbolKind::CovergroupType) {
        str.append("::");
    }
    else {
        str.push_back('.');
    }

    return str;
}